

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandDisjoint(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  uint local_54;
  int c;
  int fShort;
  int fPrint;
  int fVerbose;
  int fRecursive;
  int fGlobal;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  bVar1 = true;
  fPrint = 0;
  fShort = 0;
  c = 0;
  local_54 = 0;
  Extra_UtilGetoptReset();
LAB_0022bb3a:
  iVar2 = Extra_UtilGetopt(argc,argv,"grvpsh");
  if (iVar2 == -1) {
    if (pAVar3 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      if (bVar1) {
        iVar2 = Abc_NtkIsStrash(pAVar3);
        if (iVar2 == 0) {
          pAVar3 = Abc_NtkStrash(pAVar3,0,0,0);
          pNtkNew = Abc_NtkDsdGlobal(pAVar3,fShort,c,local_54);
          Abc_NtkDelete(pAVar3);
        }
        else {
          pNtkNew = Abc_NtkDsdGlobal(pAVar3,fShort,c,local_54);
        }
        if (pNtkNew == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Global DSD has failed.\n");
          return 1;
        }
        Abc_FrameReplaceCurrentNetwork(pAbc,pNtkNew);
      }
      else if (fPrint == 0) {
        iVar2 = Abc_NtkIsBddLogic(pAVar3);
        if (iVar2 == 0) {
          Abc_Print(-1,"This command is only applicable to logic BDD networks (run \"bdd\").\n");
          return 1;
        }
        if (fShort != 0) {
          Abc_Print(1,"Performing simple non-recursive DSD of local functions.\n");
        }
        iVar2 = Abc_NtkDsdLocal(pAVar3,fShort,0);
        if (iVar2 == 0) {
          Abc_Print(-1,"Simple DSD of local functions has failed.\n");
        }
      }
      else {
        iVar2 = Abc_NtkIsBddLogic(pAVar3);
        if (iVar2 == 0) {
          Abc_Print(-1,"This command is only applicable to logic BDD networks.\n");
          return 1;
        }
        if (fShort != 0) {
          Abc_Print(1,"Performing recursive DSD and MUX decomposition of local functions.\n");
        }
        iVar2 = Abc_NtkDsdLocal(pAVar3,fShort,fPrint);
        if (iVar2 == 0) {
          Abc_Print(-1,"Recursive DSD has failed.\n");
        }
      }
      pAbc_local._4_4_ = 0;
    }
    return pAbc_local._4_4_;
  }
  switch(iVar2) {
  case 0x67:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_0022bb3a;
  case 0x68:
    break;
  default:
    break;
  case 0x70:
    c = c ^ 1;
    goto LAB_0022bb3a;
  case 0x72:
    fPrint = fPrint ^ 1;
    goto LAB_0022bb3a;
  case 0x73:
    local_54 = local_54 ^ 1;
    goto LAB_0022bb3a;
  case 0x76:
    goto switchD_0022bb78_caseD_76;
  }
  Abc_Print(-2,"usage: dsd [-grvpsh]\n");
  Abc_Print(-2,"\t     decomposes the network using disjoint-support decomposition\n");
  pcVar4 = "local";
  if (bVar1) {
    pcVar4 = "global";
  }
  Abc_Print(-2,"\t-g     : toggle DSD of global and local functions [default = %s]\n",pcVar4);
  pcVar4 = "simple DSD";
  if (fPrint != 0) {
    pcVar4 = "recursive DSD/MUX";
  }
  Abc_Print(-2,"\t-r     : toggle recursive DSD/MUX and simple DSD [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (fShort != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-v     : prints DSD statistics and runtime [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (c != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-p     : prints DSD structure to the standard output [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (local_54 != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-s     : use short PI names when printing DSD structure [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
switchD_0022bb78_caseD_76:
  fShort = fShort ^ 1;
  goto LAB_0022bb3a;
}

Assistant:

int Abc_CommandDisjoint( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes, * pNtkNew;
    int fGlobal, fRecursive, fVerbose, fPrint, fShort, c;

    extern Abc_Ntk_t * Abc_NtkDsdGlobal( Abc_Ntk_t * pNtk, int fVerbose, int fPrint, int fShort );
    extern int         Abc_NtkDsdLocal( Abc_Ntk_t * pNtk, int fVerbose, int fRecursive );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fGlobal    = 1;
    fRecursive = 0;
    fVerbose   = 0;
    fPrint     = 0;
    fShort     = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "grvpsh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'g':
                fGlobal ^= 1;
                break;
            case 'r':
                fRecursive ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'p':
                fPrint ^= 1;
                break;
            case 's':
                fShort ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( fGlobal )
    {
//        Abc_Print( 0, "Performing DSD of global functions of the network.\n" );
        // get the new network
        if ( !Abc_NtkIsStrash(pNtk) )
        {
            pNtkNew = Abc_NtkStrash( pNtk, 0, 0, 0 );
            pNtkRes = Abc_NtkDsdGlobal( pNtkNew, fVerbose, fPrint, fShort );
            Abc_NtkDelete( pNtkNew );
        }
        else
        {
            pNtkRes = Abc_NtkDsdGlobal( pNtk, fVerbose, fPrint, fShort );
        }
        if ( pNtkRes == NULL )
        {
            Abc_Print( -1, "Global DSD has failed.\n" );
            return 1;
        }
        // replace the current network
        Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    }
    else if ( fRecursive )
    {
        if ( !Abc_NtkIsBddLogic( pNtk ) )
        {
            Abc_Print( -1, "This command is only applicable to logic BDD networks.\n" );
            return 1;
        }
        if ( fVerbose )
            Abc_Print( 1, "Performing recursive DSD and MUX decomposition of local functions.\n" );
        if ( !Abc_NtkDsdLocal( pNtk, fVerbose, fRecursive ) )
            Abc_Print( -1, "Recursive DSD has failed.\n" );
    }
    else
    {
        if ( !Abc_NtkIsBddLogic( pNtk ) )
        {
            Abc_Print( -1, "This command is only applicable to logic BDD networks (run \"bdd\").\n" );
            return 1;
        }
        if ( fVerbose )
            Abc_Print( 1, "Performing simple non-recursive DSD of local functions.\n" );
        if ( !Abc_NtkDsdLocal( pNtk, fVerbose, fRecursive ) )
            Abc_Print( -1, "Simple DSD of local functions has failed.\n" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: dsd [-grvpsh]\n" );
    Abc_Print( -2, "\t     decomposes the network using disjoint-support decomposition\n" );
    Abc_Print( -2, "\t-g     : toggle DSD of global and local functions [default = %s]\n", fGlobal? "global": "local" );
    Abc_Print( -2, "\t-r     : toggle recursive DSD/MUX and simple DSD [default = %s]\n", fRecursive? "recursive DSD/MUX": "simple DSD" );
    Abc_Print( -2, "\t-v     : prints DSD statistics and runtime [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-p     : prints DSD structure to the standard output [default = %s]\n", fPrint? "yes": "no" );
    Abc_Print( -2, "\t-s     : use short PI names when printing DSD structure [default = %s]\n", fShort? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}